

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

void deqp::egl::anon_unknown_0::anon_unknown_5::createCoordData
               (vector<float,_std::allocator<float>_> *data,TestConfig *config)

{
  int triangleNdx;
  int iVar1;
  uint uVar2;
  float local_4c;
  undefined1 local_48 [16];
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if (config->useIndices == true) {
    iVar1 = 2;
    while (iVar1 != 0) {
      local_48 = ZEXT416((uint)*(float *)(&DAT_00329e90 + (ulong)(iVar1 == 2) * 4));
      local_4c = -*(float *)(&DAT_00329e90 + (ulong)(iVar1 == 2) * 4);
      uStack_34 = 0x80000000;
      uStack_30 = 0x80000000;
      uStack_2c = 0x80000000;
      local_38 = local_4c;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = local_38;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = (float)local_48._0_4_;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = local_38;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = (float)local_48._0_4_;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = (float)local_48._0_4_;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      iVar1 = iVar1 + -1;
    }
  }
  else {
    std::vector<float,_std::allocator<float>_>::reserve(data,(long)(config->triangleCount * 6));
    for (uVar2 = 0; (int)uVar2 < config->triangleCount; uVar2 = uVar2 + 1) {
      local_48 = ZEXT416((uint)*(float *)(&DAT_00329e90 + (ulong)((uVar2 & 1) == 0) * 4));
      local_4c = -*(float *)(&DAT_00329e90 + (ulong)((uVar2 & 1) == 0) * 4);
      uStack_34 = 0x80000000;
      uStack_30 = 0x80000000;
      uStack_2c = 0x80000000;
      local_38 = local_4c;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = local_38;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = (float)local_48._0_4_;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = local_38;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = (float)local_48._0_4_;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
      local_4c = (float)local_48._0_4_;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(data,&local_4c);
    }
  }
  return;
}

Assistant:

void createCoordData (vector<float>& data, const TestConfig& config)
{
	if (config.useIndices)
	{
		for (int triangleNdx = 0; triangleNdx < 2; triangleNdx++)
		{
			const float x1 = -1.0f;
			const float y1 = -1.0f;

			const float x2 = 1.0f;
			const float y2 = 1.0f;

			const float side = ((triangleNdx % 2) == 0 ? 1.0f : -1.0f);

			data.push_back(side * x1);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y2);
		}
	}
	else
	{
		data.reserve(config.triangleCount * 3 * 2);

		for (int triangleNdx = 0; triangleNdx < config.triangleCount; triangleNdx++)
		{
			const float x1 = -1.0f;
			const float y1 = -1.0f;

			const float x2 = 1.0f;
			const float y2 = 1.0f;

			const float side = ((triangleNdx % 2) == 0 ? 1.0f : -1.0f);

			data.push_back(side * x1);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y2);
		}
	}
}